

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O0

PBuffer __thiscall DataSourceCustom::get_sound(DataSourceCustom *this,size_t index)

{
  _Setfill<char> _Var1;
  ostream *poVar2;
  element_type *this_00;
  ResInfo *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  PBuffer PVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [8];
  string fpath;
  allocator<char> local_229;
  string local_228;
  string local_208;
  undefined1 local_1e8 [8];
  string file_name;
  stringstream local_1b0 [8];
  stringstream stream;
  undefined1 local_1a0 [376];
  ResInfo *local_28;
  ResInfo *info;
  size_t index_local;
  DataSourceCustom *this_local;
  PBuffer *file;
  
  info = in_RDX;
  index_local = index;
  this_local = this;
  local_28 = get_info((DataSourceCustom *)index,AssetSound);
  if (local_28 == (ResInfo *)0x0) {
    std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    _Var1 = std::setfill<char>('0');
    poVar2 = std::operator<<(local_1a0,_Var1._M_c);
    file_name.field_2._8_4_ = std::setw(3);
    poVar2 = std::operator<<(poVar2,(_Setw)file_name.field_2._8_4_);
    std::ostream::operator<<(poVar2,(ulong)info);
    this_00 = std::__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    std::__cxx11::stringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"path",&local_229);
    std::__cxx11::stringstream::str();
    ConfigFile::value((string *)local_1e8,this_00,&local_208,&local_228,
                      (string *)((long)&fpath.field_2 + 8));
    std::__cxx11::string::~string((string *)(fpath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator+(&local_290,&local_28->path,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                   &local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::__cxx11::string::~string((string *)&local_290);
    std::make_shared<Buffer,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    _Var3._M_pi = extraout_RDX_00;
  }
  PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
DataSourceCustom::get_sound(size_t index) {
  ResInfo *info = get_info(Data::AssetSound);
  if (info == nullptr) {
    return nullptr;
  }

  std::stringstream stream;
  stream << std::setfill('0') << std::setw(3) << index;
  std::string file_name = info->meta->value(stream.str(), "path", stream.str());
  std::string fpath = info->path + "/" + file_name;

  try {
    PBuffer file = std::make_shared<Buffer>(fpath);
    return file;
  } catch (...) {
    return nullptr;
  }
}